

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O3

double MakeAngleContinuous(double angle,double lastangle)

{
  if (lastangle + 180.0 < angle) {
    do {
      angle = angle + -360.0;
    } while (lastangle + 180.0 < angle);
  }
  for (; angle < lastangle + -180.0; angle = angle + 360.0) {
  }
  return angle;
}

Assistant:

double MakeAngleContinuous(double angle, double lastangle)
{
    while (angle > lastangle + 180.0)
        angle -= 360.0;

    while (angle < lastangle - 180.0)
        angle += 360.0;

    return angle;
}